

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O1

SessionFactory *
FileSendSession::create_session_factory(SessionFactory *__return_storage_ptr__,path *path)

{
  pointer pcVar1;
  string *psVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  pcVar1 = (path->m_pathname)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (path->m_pathname)._M_string_length);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  psVar2 = (string *)operator_new(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_40,local_38 + (long)local_40);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = psVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/FileSendSession.cpp:57:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/FileSendSession.cpp:57:10)>
       ::_M_manager;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TCPServer::SessionFactory FileSendSession::create_session_factory(const fs::path &path) {
  return [=](Poll &p, TCPServer &server, sockaddr_in client) -> std::shared_ptr<Subscriber> {
    p.unsubscribe(server);
    auto s = std::make_shared<FileSendSession>(path);
    s->when_success([](auto a) { std::cout << "Sent file " << a << std::endl; });
    s->when_error([](auto a) { std::cout << "Could not send file " << a << std::endl; });
    return s;
  };
}